

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O3

int64_t wallet::wallet_tests::AddTx
                  (ChainstateManager *chainman,CWallet *wallet,uint32_t lockTime,int64_t mockTime,
                  int64_t blockTime)

{
  uint uVar1;
  _Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> _Var2;
  CWalletTx *pCVar3;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>,_bool>
  pVar4;
  Span<unsigned_char> bytes;
  CMutableTransaction tx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock41;
  uint256 hash;
  TxState state;
  bool rescanning_old_block;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  undefined1 local_101;
  CMutableTransaction local_100;
  unique_lock<std::recursive_mutex> local_c8;
  undefined1 local_b8 [24];
  code *pcStack_a0;
  undefined4 local_98;
  undefined4 local_94;
  uchar local_88 [36];
  variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
  local_64 [40];
  undefined1 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_100);
  local_64[0] = (variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
                 )0x0;
  local_3c = 3;
  local_100.nLockTime = lockTime;
  SetMockTime(mockTime);
  if (0 < blockTime) {
    local_c8._M_device = &cs_main.super_recursive_mutex;
    local_c8._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_c8);
    local_88[0x10] = '\0';
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    local_88[0x18] = '\0';
    local_88[0x19] = '\0';
    local_88[0x1a] = '\0';
    local_88[0x1b] = '\0';
    local_88[0x1c] = '\0';
    local_88[0x1d] = '\0';
    local_88[0x1e] = '\0';
    local_88[0x1f] = '\0';
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    bytes.m_size = 0x20;
    bytes.m_data = local_88;
    GetRandBytes(bytes);
    local_b8[0x10] = local_88[0x10];
    local_b8[0x11] = local_88[0x11];
    local_b8[0x12] = local_88[0x12];
    local_b8[0x13] = local_88[0x13];
    local_b8[0x14] = local_88[0x14];
    local_b8[0x15] = local_88[0x15];
    local_b8[0x16] = local_88[0x16];
    local_b8[0x17] = local_88[0x17];
    pcStack_a0._0_1_ = local_88[0x18];
    pcStack_a0._1_1_ = local_88[0x19];
    pcStack_a0._2_1_ = local_88[0x1a];
    pcStack_a0._3_1_ = local_88[0x1b];
    pcStack_a0._4_1_ = local_88[0x1c];
    pcStack_a0._5_1_ = local_88[0x1d];
    pcStack_a0._6_1_ = local_88[0x1e];
    pcStack_a0._7_1_ = local_88[0x1f];
    local_b8[0] = local_88[0];
    local_b8[1] = local_88[1];
    local_b8[2] = local_88[2];
    local_b8[3] = local_88[3];
    local_b8[4] = local_88[4];
    local_b8[5] = local_88[5];
    local_b8[6] = local_88[6];
    local_b8[7] = local_88[7];
    local_b8[8] = local_88[8];
    local_b8[9] = local_88[9];
    local_b8[10] = local_88[10];
    local_b8[0xb] = local_88[0xb];
    local_b8[0xc] = local_88[0xc];
    local_b8[0xd] = local_88[0xd];
    local_b8[0xe] = local_88[0xe];
    local_b8[0xf] = local_88[0xf];
    pVar4 = std::
            _Hashtable<uint256,std::pair<uint256_const,CBlockIndex>,std::allocator<std::pair<uint256_const,CBlockIndex>>,std::__detail::_Select1st,std::equal_to<uint256>,BlockHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::piecewise_construct_t_const&,std::tuple<uint256>,std::tuple<>>
                      ((_Hashtable<uint256,std::pair<uint256_const,CBlockIndex>,std::allocator<std::pair<uint256_const,CBlockIndex>>,std::__detail::_Select1st,std::equal_to<uint256>,BlockHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&(chainman->m_blockman).m_block_index,&std::piecewise_construct,local_b8,
                       &local_101);
    _Var2 = pVar4.first.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
            _M_cur;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("inserted.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                    ,0x195,
                    "int64_t wallet::wallet_tests::AddTx(ChainstateManager &, CWallet &, uint32_t, int64_t, int64_t)"
                   );
    }
    *(int *)((long)_Var2.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                   _M_cur + 0xa8) = (int)blockTime;
    *(long *)((long)_Var2.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                    _M_cur + 0x28) =
         (long)_Var2.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur +
         8;
    local_98 = *(int *)((long)_Var2.
                              super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                              ._M_cur + 0x40);
    local_b8._0_8_ =
         *(undefined8 *)
          ((long)_Var2.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur
          + 8);
    local_b8._8_8_ =
         *(undefined8 *)
          ((long)_Var2.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur
          + 0x10);
    local_b8._16_8_ =
         *(undefined8 *)
          ((long)_Var2.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur
          + 0x18);
    pcStack_a0 = *(code **)((long)_Var2.
                                  super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                                  ._M_cur + 0x20);
    local_94 = 0;
    std::
    variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
    ::operator=(local_64,(TxStateConfirmed *)local_b8);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_c8);
  }
  rescanning_old_block = false;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_110,(CTransaction **)&stack0xfffffffffffffee8,
             (allocator<CTransaction> *)local_b8,&local_100);
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  local_b8._0_8_ = local_64;
  pcStack_a0 = std::
               _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:412:62)>
               ::_M_invoke;
  local_b8._16_8_ =
       std::
       _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:412:62)>
       ::_M_manager;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._0_8_;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xfffffffffffffee8;
  pCVar3 = CWallet::AddToWallet
                     (wallet,tx_00,(TxState *)local_b8,(UpdateWalletTxFn *)0x1,false,
                      rescanning_old_block);
  uVar1 = pCVar3->nTimeSmart;
  if ((code *)local_b8._16_8_ != (code *)0x0) {
    (*(code *)local_b8._16_8_)(local_b8,local_b8,3);
  }
  if ((pointer)local_110._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_100.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_100.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (ulong)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int64_t AddTx(ChainstateManager& chainman, CWallet& wallet, uint32_t lockTime, int64_t mockTime, int64_t blockTime)
{
    CMutableTransaction tx;
    TxState state = TxStateInactive{};
    tx.nLockTime = lockTime;
    SetMockTime(mockTime);
    CBlockIndex* block = nullptr;
    if (blockTime > 0) {
        LOCK(cs_main);
        auto inserted = chainman.BlockIndex().emplace(std::piecewise_construct, std::make_tuple(GetRandHash()), std::make_tuple());
        assert(inserted.second);
        const uint256& hash = inserted.first->first;
        block = &inserted.first->second;
        block->nTime = blockTime;
        block->phashBlock = &hash;
        state = TxStateConfirmed{hash, block->nHeight, /*index=*/0};
    }
    return wallet.AddToWallet(MakeTransactionRef(tx), state, [&](CWalletTx& wtx, bool /* new_tx */) {
        // Assign wtx.m_state to simplify test and avoid the need to simulate
        // reorg events. Without this, AddToWallet asserts false when the same
        // transaction is confirmed in different blocks.
        wtx.m_state = state;
        return true;
    })->nTimeSmart;
}